

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

void __thiscall obx::Store::Store(Store *this,OBX_store *ptr,bool owned)

{
  this->_vptr_Store = (_func_int **)&PTR__Store_00112898;
  (this->cStore_)._M_b._M_p = ptr;
  this->owned_ = owned;
  (this->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->syncClientMutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->syncClientMutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->syncClientMutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->syncClientMutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->syncClientMutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  if ((this->cStore_)._M_b._M_p != (__pointer_type)0x0) {
    return;
  }
  internal::throwIllegalArgumentException("Argument validation failed: ","cStore_ != nullptr");
}

Assistant:

explicit Store(OBX_store* ptr, bool owned) : cStore_(ptr), owned_(owned) {
        OBX_VERIFY_ARGUMENT(cStore_ != nullptr);
    }